

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_q.h
# Opt level: O0

void __thiscall
spdlog::details::circular_q<spdlog::details::log_msg_buffer>::circular_q
          (circular_q<spdlog::details::log_msg_buffer> *this,size_t max_items)

{
  long in_RSI;
  long *in_RDI;
  allocator_type *__a;
  size_type in_stack_ffffffffffffffd8;
  vector<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_>
  *in_stack_ffffffffffffffe0;
  allocator_type local_11 [17];
  
  *in_RDI = in_RSI + 1;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  __a = local_11;
  std::allocator<spdlog::details::log_msg_buffer>::allocator
            ((allocator<spdlog::details::log_msg_buffer> *)0x1a7879);
  std::vector<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_>::
  vector(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,__a);
  std::allocator<spdlog::details::log_msg_buffer>::~allocator
            ((allocator<spdlog::details::log_msg_buffer> *)0x1a7899);
  return;
}

Assistant:

explicit circular_q(size_t max_items)
        : max_items_(max_items + 1) // one item is reserved as marker for full q
        , v_(max_items_)
    {}